

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O3

bool __thiscall r_exec::HLPOverlay::evaluate_fwd_guards(HLPOverlay *this)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  short sVar4;
  short sVar5;
  uint16_t index;
  HLPContext c;
  uint16_t local_56;
  uint local_54;
  HLPContext local_50;
  
  sVar4 = r_code::Atom::asIndex();
  bVar1 = r_code::Atom::getAtomCount();
  if (bVar1 == 0) {
    bVar3 = true;
  }
  else {
    bVar3 = false;
    HLPContext::HLPContext(&local_50,(this->super_Overlay).code,sVar4 + 1,this,STEM);
    bVar2 = HLPContext::evaluate(&local_50,&local_56);
    if (bVar2) {
      local_54 = (uint)bVar1;
      index = sVar4 + 2;
      sVar4 = -1;
      do {
        sVar5 = sVar4;
        if ((ushort)-(ushort)bVar1 == sVar5) break;
        HLPContext::HLPContext(&local_50,(this->super_Overlay).code,index,this,STEM);
        bVar3 = HLPContext::evaluate(&local_50,&local_56);
        index = index + 1;
        sVar4 = sVar5 + -1;
      } while (bVar3);
      bVar3 = (ushort)local_54 <= (ushort)-sVar5;
    }
  }
  return bVar3;
}

Assistant:

bool HLPOverlay::evaluate_fwd_guards()
{
    return evaluate_guards(HLP_FWD_GUARDS);
}